

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O1

Vec_Int_t * Llb_ManCollectHighFanoutObjects(Aig_Man_t *pAig,int nCandMax,int fCisOnly)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  int Temp;
  long lVar10;
  uint uVar11;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      piVar6 = (int *)pVVar7->pArray[lVar10];
      if (piVar6 != (int *)0x0) {
        uVar11 = (uint)*(ulong *)(piVar6 + 6);
        if ((((uVar11 & 7) == 2) && (pAig->nTruePis <= *piVar6)) ||
           ((fCisOnly == 0 && (0xfffffffd < (uVar11 & 7) - 7)))) {
          Vec_IntPush(pVVar5,(uint)(*(ulong *)(piVar6 + 6) >> 6) & 0x3ffffff);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  piVar6 = pVVar5->pArray;
  iVar1 = pVVar5->nSize;
  qsort(piVar6,(long)iVar1,4,Vec_IntSortCompare2);
  uVar11 = iVar1 - 1;
  if (nCandMax < (int)uVar11) {
    uVar11 = nCandMax;
  }
  if ((int)uVar11 < 0) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = piVar6[uVar11];
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    pVVar5->pArray = (int *)0x0;
  }
  free(pVVar5);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      piVar6 = (int *)pVVar7->pArray[lVar10];
      if (piVar6 != (int *)0x0) {
        uVar8 = (uint)*(ulong *)(piVar6 + 6);
        if (((((uVar8 & 7) == 2) && (pAig->nTruePis <= *piVar6)) ||
            ((fCisOnly == 0 && (0xfffffffd < (uVar8 & 7) - 7)))) &&
           (iVar1 <= (int)((uint)(*(ulong *)(piVar6 + 6) >> 6) & 0x3ffffff))) {
          Vec_IntPush(pVVar5,piVar6[9]);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  iVar1 = pVVar5->nSize;
  if (iVar1 < (int)uVar11) {
    __assert_fail("Vec_IntSize(vResult) >= nCandMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                  ,0x7f,"Vec_Int_t *Llb_ManCollectHighFanoutObjects(Aig_Man_t *, int, int)");
  }
  if (1 < iVar1) {
    piVar6 = pVVar5->pArray;
    do {
      uVar9 = 0;
      bVar4 = false;
      do {
        iVar2 = piVar6[uVar9];
        if (((long)iVar2 < 0) || (pVVar7->nSize <= iVar2)) {
LAB_008195b7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar3 = piVar6[uVar9 + 1];
        if (((long)iVar3 < 0) || (pVVar7->nSize <= iVar3)) goto LAB_008195b7;
        if (*(uint *)((long)pVVar7->pArray[iVar2] + 0x18) >> 6 <
            *(uint *)((long)pVVar7->pArray[iVar3] + 0x18) >> 6) {
          piVar6[uVar9] = iVar3;
          piVar6[uVar9 + 1] = iVar2;
          bVar4 = true;
        }
        uVar9 = uVar9 + 1;
      } while (iVar1 - 1 != uVar9);
    } while ((bVar4) && (1 < iVar1));
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Llb_ManCollectHighFanoutObjects( Aig_Man_t * pAig, int nCandMax, int fCisOnly )
{
    Vec_Int_t * vFanouts, * vResult;
    Aig_Obj_t * pObj; 
    int i, fChanges, PivotValue;
//    int Entry;
    // collect fanout counts
    vFanouts = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        Vec_IntPush( vFanouts, Aig_ObjRefs(pObj) );
    }
    Vec_IntSort( vFanouts, 1 );
    // pick the separator
    nCandMax = Abc_MinInt( nCandMax, Vec_IntSize(vFanouts) - 1 );
    PivotValue = Vec_IntEntry( vFanouts, nCandMax );
    Vec_IntFree( vFanouts );
    // collect obj satisfying the constraints
    vResult = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        if ( Aig_ObjRefs(pObj) < PivotValue )
            continue;
        Vec_IntPush( vResult, Aig_ObjId(pObj) );
    }
    assert( Vec_IntSize(vResult) >= nCandMax );
    // order in the decreasing order of fanouts
    do
    {
        fChanges = 0;
        for ( i = 0; i < Vec_IntSize(vResult) - 1; i++ )
            if ( Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i))) < 
                 Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i+1))) )
            {
                int Temp = Vec_IntEntry( vResult, i );
                Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vResult, i+1) );
                Vec_IntWriteEntry( vResult, i+1, Temp );
                fChanges = 1;
            }
    }
    while ( fChanges );
/*
    Vec_IntForEachEntry( vResult, Entry, i )
        printf( "%d ", Aig_ObjRefs(Aig_ManObj(pAig, Entry)) );
printf( "\n" );
*/
    return vResult;
}